

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib666.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong local_40;
  size_t i;
  curl_mimepart *part;
  curl_mime *mime;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  part = (curl_mimepart *)0x0;
  for (local_40 = 0; local_40 < 17000; local_40 = local_40 + 1) {
    if (local_40 % 0x4d == 0x4c) {
      buffer[local_40] = '\n';
    }
    else {
      buffer[local_40] = (char)(local_40 % 0x1a) + 'A';
    }
  }
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      mime._4_4_ = 0x7e;
    }
    else {
      part = (curl_mimepart *)curl_mime_init(lVar2);
      if (part == (curl_mimepart *)0x0) {
        curl_mfprintf(_stderr,"curl_mime_init() failed\n");
        mime._4_4_ = 0x7e;
      }
      else {
        lVar3 = curl_mime_addpart(part);
        if (lVar3 == 0) {
          curl_mfprintf(_stderr,"curl_mime_addpart() failed\n");
          mime._4_4_ = 0x7e;
        }
        else {
          mime._4_4_ = curl_mime_name(lVar3,"upfile");
          if (mime._4_4_ == 0) {
            mime._4_4_ = curl_mime_filename(lVar3,"myfile.txt");
            if (mime._4_4_ == 0) {
              mime._4_4_ = curl_mime_data(lVar3,buffer,17000);
              if (mime._4_4_ == 0) {
                mime._4_4_ = curl_mime_encoder(lVar3,"binary");
                if (mime._4_4_ == 0) {
                  mime._4_4_ = curl_easy_setopt(lVar2,0x2712,URL);
                  if ((((mime._4_4_ == 0) &&
                       (mime._4_4_ = curl_easy_setopt(lVar2,0x281d,part), mime._4_4_ == 0)) &&
                      (mime._4_4_ = curl_easy_setopt(lVar2,0x118,0x401b), mime._4_4_ == 0)) &&
                     ((mime._4_4_ = curl_easy_setopt(lVar2,0x29,1), mime._4_4_ == 0 &&
                      (mime._4_4_ = curl_easy_setopt(lVar2,0x2a,1), mime._4_4_ == 0)))) {
                    mime._4_4_ = curl_easy_perform(lVar2);
                  }
                }
                else {
                  curl_mfprintf(_stderr,"curl_mime_encoder() failed\n");
                }
              }
              else {
                curl_mfprintf(_stderr,"curl_mime_data() failed\n");
              }
            }
            else {
              curl_mfprintf(_stderr,"curl_mime_filename() failed\n");
            }
          }
          else {
            curl_mfprintf(_stderr,"curl_mime_name() failed\n");
          }
        }
      }
    }
    curl_easy_cleanup(lVar2);
    curl_mime_free(part);
    curl_global_cleanup();
    URL_local._4_4_ = mime._4_4_;
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl = NULL;
  CURLcode res = CURLE_OK;
  curl_mime *mime = NULL;
  curl_mimepart *part;
  size_t i;

  /* Checks huge binary-encoded mime post. */

  /* Create a buffer with pseudo-binary data. */
  for(i = 0; i < sizeof(buffer); i++)
    if(i % 77 == 76)
      buffer[i] = '\n';
    else
      buffer[i] = (char) (0x41 + i % 26); /* A...Z */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  /* Build mime structure. */
  mime = curl_mime_init(curl);
  if(!mime) {
    fprintf(stderr, "curl_mime_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  res = curl_mime_name(part, "upfile");
  if(res) {
    fprintf(stderr, "curl_mime_name() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_filename(part, "myfile.txt");
  if(res) {
    fprintf(stderr, "curl_mime_filename() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_data(part, buffer, sizeof(buffer));
  if(res) {
    fprintf(stderr, "curl_mime_data() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_encoder(part, "binary");
  if(res) {
    fprintf(stderr, "curl_mime_encoder() failed\n");
    goto test_cleanup;
  }

  /* First set the URL that is about to receive our mime mail. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Post form */
  test_setopt(curl, CURLOPT_MIMEPOST, mime);

  /* Shorten upload buffer. */
  test_setopt(curl, CURLOPT_UPLOAD_BUFFERSIZE, 16411L);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the mime structure */
  curl_mime_free(mime);

  curl_global_cleanup();

  return res;
}